

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

void __thiscall backend::codegen::Codegen::deal_phi(Codegen *this,PhiInst *phi)

{
  Tag *this_00;
  VarId *x;
  pointer pVVar1;
  PhiInst *tag;
  Function *pFVar2;
  char *tag_00;
  VarId dest;
  ostream local_153;
  allocator<char> local_152;
  allocator<char> local_151;
  string local_150;
  undefined1 local_130 [48];
  undefined **local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  undefined **local_e8;
  uint32_t local_e0;
  VarId local_d8;
  undefined1 local_c8 [64];
  Function local_88;
  
  local_e8 = &PTR_display_001d90d0;
  local_e0 = (phi->super_Inst).dest.id;
  local_153 = (ostream)0x0;
  tag = phi;
  local_130._32_8_ = this;
  AixLog::operator<<(&local_153,(Severity *)phi);
  AixLog::Tag::Tag((Tag *)(local_c8 + 0x10));
  AixLog::operator<<((ostream *)(local_c8 + 0x10),(Tag *)tag);
  local_f8._M_allocated_capacity = std::chrono::_V2::system_clock::now();
  local_100 = &PTR__Timestamp_001d8f28;
  local_f8._M_local_buf[8] = '\0';
  AixLog::operator<<((ostream *)&local_100,(Timestamp *)tag);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_130,"deal_phi",&local_151);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,
             "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/codegen.cpp"
             ,&local_152);
  pFVar2 = (Function *)local_130;
  AixLog::Function::Function(&local_88,(string *)pFVar2,&local_150,0x178);
  AixLog::operator<<((ostream *)&local_88,pFVar2);
  (*(code *)*local_e8)(&local_e8,&std::clog);
  tag_00 = " <- ";
  std::operator<<((ostream *)&std::clog," <- ");
  AixLog::Function::~Function(&local_88);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)local_130);
  this_00 = (Tag *)(local_c8 + 0x10);
  AixLog::Tag::~Tag(this_00);
  local_130._40_8_ =
       (phi->vars).super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
       super__Vector_impl_data._M_finish;
  for (pVVar1 = (phi->vars).super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                _M_impl.super__Vector_impl_data._M_start; pVVar1 != (pointer)local_130._40_8_;
      pVVar1 = pVVar1 + 1) {
    local_153 = (ostream)0x0;
    AixLog::operator<<(&local_153,(Severity *)tag_00);
    AixLog::Tag::Tag(this_00);
    AixLog::operator<<((ostream *)this_00,(Tag *)tag_00);
    local_f8._M_allocated_capacity = std::chrono::_V2::system_clock::now();
    local_100 = &PTR__Timestamp_001d8f28;
    local_f8._M_local_buf[8] = '\0';
    AixLog::operator<<((ostream *)&local_100,(Timestamp *)tag_00);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_130,"deal_phi",&local_151);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_150,
               "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/codegen.cpp"
               ,&local_152);
    pFVar2 = (Function *)local_130;
    AixLog::Function::Function(&local_88,(string *)local_130,&local_150,0x17a);
    AixLog::operator<<((ostream *)&local_88,pFVar2);
    (**(pVVar1->super_Displayable)._vptr_Displayable)(pVVar1,&std::clog);
    std::operator<<((ostream *)&std::clog," ");
    AixLog::Function::~Function(&local_88);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)local_130);
    AixLog::Tag::~Tag(this_00);
    local_c8._0_8_ = &PTR_display_001d90d0;
    local_c8._8_4_ = local_e0;
    local_d8.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
    local_d8.id = pVVar1->id;
    tag_00 = local_c8;
    add_collapsed_var((Codegen *)local_130._32_8_,(VarId *)tag_00,&local_d8);
  }
  local_153 = (ostream)0x0;
  AixLog::operator<<(&local_153,(Severity *)tag_00);
  AixLog::Tag::Tag((Tag *)(local_c8 + 0x10));
  AixLog::operator<<((ostream *)(local_c8 + 0x10),(Tag *)tag_00);
  local_f8._M_allocated_capacity = std::chrono::_V2::system_clock::now();
  local_100 = &PTR__Timestamp_001d8f28;
  local_f8._M_local_buf[8] = '\0';
  AixLog::operator<<((ostream *)&local_100,(Timestamp *)tag_00);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_130,"deal_phi",&local_151);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,
             "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/codegen.cpp"
             ,&local_152);
  pFVar2 = (Function *)local_130;
  AixLog::Function::Function(&local_88,(string *)pFVar2,&local_150,0x17e);
  AixLog::operator<<((ostream *)&local_88,pFVar2);
  std::endl<char,std::char_traits<char>>((ostream *)&std::clog);
  AixLog::Function::~Function(&local_88);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)local_130);
  AixLog::Tag::~Tag((Tag *)(local_c8 + 0x10));
  return;
}

Assistant:

void Codegen::deal_phi(mir::inst::PhiInst& phi) {
  auto dest = phi.dest;
  LOG(TRACE) << dest << " <- ";
  for (auto& x : phi.vars) {
    LOG(TRACE) << x << " ";
    add_collapsed_var(dest, x);
    // var_collapse.insert({x, dest});
  }
  LOG(TRACE) << std::endl;
}